

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_0_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  uint uVar49;
  long lVar50;
  bool bVar51;
  undefined2 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar79 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined8 uVar125;
  undefined8 uVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  short sStack_194;
  undefined1 local_118 [32];
  
  bVar51 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar43 = (long)dir;
  lVar35 = (long)cdef_directions_padded[lVar43 + 2][0];
  lVar36 = (long)cdef_directions_padded[lVar43 + 2][1];
  lVar37 = (long)cdef_directions_padded[lVar43 + 4][0];
  lVar39 = (long)cdef_directions_padded[lVar43 + 4][1];
  lVar47 = (long)cdef_directions_padded[lVar43][0];
  lVar43 = (long)cdef_directions_padded[lVar43][1];
  local_118._2_2_ = (undefined2)pri_strength;
  uVar52 = (undefined2)sec_strength;
  if (block_width == 8) {
    uVar42 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar42 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar42 = 0;
      }
    }
    uVar49 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar49 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar49 = 0;
      }
    }
    local_118._0_2_ = local_118._2_2_;
    local_118._4_2_ = local_118._2_2_;
    local_118._6_2_ = local_118._2_2_;
    local_118._8_2_ = local_118._2_2_;
    local_118._10_2_ = local_118._2_2_;
    local_118._12_2_ = local_118._2_2_;
    local_118._14_2_ = local_118._2_2_;
    local_118._16_2_ = local_118._2_2_;
    local_118._18_2_ = local_118._2_2_;
    local_118._20_2_ = local_118._2_2_;
    local_118._22_2_ = local_118._2_2_;
    local_118._24_2_ = local_118._2_2_;
    local_118._26_2_ = local_118._2_2_;
    local_118._28_2_ = local_118._2_2_;
    local_118._30_2_ = local_118._2_2_;
    auVar53 = ZEXT416(uVar42);
    auVar54 = ZEXT416(uVar49);
    sStack_194 = (short)(dstride >> 0x1f);
    for (lVar41 = 0; lVar41 < block_height; lVar41 = lVar41 + 2) {
      auVar123 = ZEXT116(0) * *(undefined1 (*) [16])in +
                 ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
      auVar55 = ZEXT116(1) * *(undefined1 (*) [16])in;
      uVar125 = auVar55._0_8_;
      uVar126 = auVar55._8_8_;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar35 * 2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar35 * 2));
      auVar105._16_16_ = auVar55;
      auVar105._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar35 * -2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar35 * -2 + 0x120));
      auVar118._16_16_ = auVar55;
      auVar118._0_16_ = auVar56;
      auVar4._16_8_ = uVar125;
      auVar4._0_16_ = auVar123;
      auVar4._24_8_ = uVar126;
      auVar61 = vpsubw_avx2(auVar105,auVar4);
      auVar98 = vpsraw_avx2(auVar61,0xf);
      auVar61 = vpabsw_avx2(auVar61);
      auVar81 = vpsrlw_avx2(auVar61,auVar53);
      auVar81 = vpsubusw_avx2(local_118,auVar81);
      auVar61 = vpminsw_avx2(auVar81,auVar61);
      auVar81 = vpaddw_avx2(auVar61,auVar98);
      auVar5._16_8_ = uVar125;
      auVar5._0_16_ = auVar123;
      auVar5._24_8_ = uVar126;
      auVar99 = vpsubw_avx2(auVar118,auVar5);
      auVar61 = vpabsw_avx2(auVar99);
      auVar3 = vpsrlw_avx2(auVar61,auVar53);
      auVar99 = vpsraw_avx2(auVar99,0xf);
      auVar3 = vpsubusw_avx2(local_118,auVar3);
      auVar61 = vpminsw_avx2(auVar61,auVar3);
      auVar61 = vpaddw_avx2(auVar61,auVar99);
      auVar61 = vpaddw_avx2(auVar61 ^ auVar99,auVar81 ^ auVar98);
      uVar1 = (undefined2)cdef_pri_taps[bVar51][0];
      auVar100._2_2_ = uVar1;
      auVar100._0_2_ = uVar1;
      auVar100._4_2_ = uVar1;
      auVar100._6_2_ = uVar1;
      auVar100._8_2_ = uVar1;
      auVar100._10_2_ = uVar1;
      auVar100._12_2_ = uVar1;
      auVar100._14_2_ = uVar1;
      auVar100._16_2_ = uVar1;
      auVar100._18_2_ = uVar1;
      auVar100._20_2_ = uVar1;
      auVar100._22_2_ = uVar1;
      auVar100._24_2_ = uVar1;
      auVar100._26_2_ = uVar1;
      auVar100._28_2_ = uVar1;
      auVar100._30_2_ = uVar1;
      auVar3 = vpmullw_avx2(auVar61,auVar100);
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar36 * 2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar36 * 2));
      auVar59._16_16_ = auVar55;
      auVar59._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar36 * -2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar36 * -2 + 0x120));
      auVar130._16_16_ = auVar55;
      auVar130._0_16_ = auVar56;
      auVar6._16_8_ = uVar125;
      auVar6._0_16_ = auVar123;
      auVar6._24_8_ = uVar126;
      auVar61 = vpsubw_avx2(auVar59,auVar6);
      auVar137 = vpsraw_avx2(auVar61,0xf);
      auVar61 = vpabsw_avx2(auVar61);
      auVar81 = vpsrlw_avx2(auVar61,auVar53);
      auVar81 = vpsubusw_avx2(local_118,auVar81);
      auVar61 = vpminsw_avx2(auVar61,auVar81);
      auVar81 = vpaddw_avx2(auVar61,auVar137);
      auVar7._16_8_ = uVar125;
      auVar7._0_16_ = auVar123;
      auVar7._24_8_ = uVar126;
      auVar98 = vpsubw_avx2(auVar130,auVar7);
      auVar61 = vpabsw_avx2(auVar98);
      auVar99 = vpsrlw_avx2(auVar61,auVar53);
      auVar98 = vpsraw_avx2(auVar98,0xf);
      auVar99 = vpsubusw_avx2(local_118,auVar99);
      auVar61 = vpminsw_avx2(auVar61,auVar99);
      auVar61 = vpaddw_avx2(auVar61,auVar98);
      auVar61 = vpaddw_avx2(auVar61 ^ auVar98,auVar81 ^ auVar137);
      uVar1 = (undefined2)cdef_pri_taps[bVar51][1];
      auVar138._2_2_ = uVar1;
      auVar138._0_2_ = uVar1;
      auVar138._4_2_ = uVar1;
      auVar138._6_2_ = uVar1;
      auVar138._8_2_ = uVar1;
      auVar138._10_2_ = uVar1;
      auVar138._12_2_ = uVar1;
      auVar138._14_2_ = uVar1;
      auVar138._16_2_ = uVar1;
      auVar138._18_2_ = uVar1;
      auVar138._20_2_ = uVar1;
      auVar138._22_2_ = uVar1;
      auVar138._24_2_ = uVar1;
      auVar138._26_2_ = uVar1;
      auVar138._28_2_ = uVar1;
      auVar138._30_2_ = uVar1;
      auVar61 = vpmullw_avx2(auVar61,auVar138);
      auVar81 = vpaddw_avx2(auVar61,auVar3);
      auVar26._8_2_ = 0xbfff;
      auVar26._0_8_ = 0xbfffbfffbfffbfff;
      auVar26._10_2_ = 0xbfff;
      auVar26._12_2_ = 0xbfff;
      auVar26._14_2_ = 0xbfff;
      auVar26._16_2_ = 0xbfff;
      auVar26._18_2_ = 0xbfff;
      auVar26._20_2_ = 0xbfff;
      auVar26._22_2_ = 0xbfff;
      auVar26._24_2_ = 0xbfff;
      auVar26._26_2_ = 0xbfff;
      auVar26._28_2_ = 0xbfff;
      auVar26._30_2_ = 0xbfff;
      auVar61 = vpand_avx2(auVar105,auVar26);
      auVar3 = vpand_avx2(auVar118,auVar26);
      auVar3 = vpmaxsw_avx2(auVar61,auVar3);
      auVar61 = vpand_avx2(auVar59,auVar26);
      auVar3 = vpmaxsw_avx2(auVar3,auVar61);
      auVar61 = vpand_avx2(auVar130,auVar26);
      auVar98 = vpmaxsw_avx2(auVar3,auVar61);
      auVar61 = vpminsw_avx2(auVar105,auVar118);
      auVar61 = vpminsw_avx2(auVar61,auVar59);
      auVar137 = vpminsw_avx2(auVar130,auVar61);
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar37 * 2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar37 * 2));
      auVar97._16_16_ = auVar55;
      auVar97._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar37 * -2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar37 * -2 + 0x120));
      auVar133._16_16_ = auVar55;
      auVar133._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar47 * 2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar47 * 2));
      auVar139._16_16_ = auVar55;
      auVar139._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar47 * -2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar47 * -2 + 0x120));
      auVar140._16_16_ = auVar55;
      auVar140._0_16_ = auVar56;
      auVar8._16_8_ = uVar125;
      auVar8._0_16_ = auVar123;
      auVar8._24_8_ = uVar126;
      auVar99 = vpsubw_avx2(auVar97,auVar8);
      auVar61 = vpabsw_avx2(auVar99);
      auVar3 = vpsrlw_avx2(auVar61,auVar54);
      auVar60 = vpsraw_avx2(auVar99,0xf);
      auVar32._2_2_ = uVar52;
      auVar32._0_2_ = uVar52;
      auVar32._4_2_ = uVar52;
      auVar32._6_2_ = uVar52;
      auVar32._8_2_ = uVar52;
      auVar32._10_2_ = uVar52;
      auVar32._12_2_ = uVar52;
      auVar32._14_2_ = uVar52;
      auVar32._16_2_ = uVar52;
      auVar32._18_2_ = uVar52;
      auVar32._20_2_ = uVar52;
      auVar32._22_2_ = uVar52;
      auVar32._24_2_ = uVar52;
      auVar32._26_2_ = uVar52;
      auVar32._28_2_ = uVar52;
      auVar32._30_2_ = uVar52;
      auVar3 = vpsubusw_avx2(auVar32,auVar3);
      auVar61 = vpminsw_avx2(auVar61,auVar3);
      auVar3 = vpaddw_avx2(auVar61,auVar60);
      auVar9._16_8_ = uVar125;
      auVar9._0_16_ = auVar123;
      auVar9._24_8_ = uVar126;
      auVar61 = vpsubw_avx2(auVar133,auVar9);
      auVar119 = vpsraw_avx2(auVar61,0xf);
      auVar61 = vpabsw_avx2(auVar61);
      auVar99 = vpsrlw_avx2(auVar61,auVar54);
      auVar99 = vpsubusw_avx2(auVar32,auVar99);
      auVar61 = vpminsw_avx2(auVar99,auVar61);
      auVar61 = vpaddw_avx2(auVar61,auVar119);
      auVar3 = vpaddw_avx2(auVar61 ^ auVar119,auVar3 ^ auVar60);
      auVar10._16_8_ = uVar125;
      auVar10._0_16_ = auVar123;
      auVar10._24_8_ = uVar126;
      auVar61 = vpsubw_avx2(auVar139,auVar10);
      auVar120 = vpsraw_avx2(auVar61,0xf);
      auVar61 = vpabsw_avx2(auVar61);
      auVar99 = vpsrlw_avx2(auVar61,auVar54);
      auVar99 = vpsubusw_avx2(auVar32,auVar99);
      auVar61 = vpminsw_avx2(auVar99,auVar61);
      auVar99 = vpaddw_avx2(auVar61,auVar120);
      auVar11._16_8_ = uVar125;
      auVar11._0_16_ = auVar123;
      auVar11._24_8_ = uVar126;
      auVar119 = vpsubw_avx2(auVar140,auVar11);
      auVar61 = vpabsw_avx2(auVar119);
      auVar60 = vpsrlw_avx2(auVar61,auVar54);
      auVar119 = vpsraw_avx2(auVar119,0xf);
      auVar60 = vpsubusw_avx2(auVar32,auVar60);
      auVar61 = vpminsw_avx2(auVar61,auVar60);
      auVar61 = vpaddw_avx2(auVar61,auVar119);
      auVar61 = vpaddw_avx2(auVar99 ^ auVar120,auVar61 ^ auVar119);
      auVar61 = vpaddw_avx2(auVar3,auVar61);
      auVar31._8_2_ = 2;
      auVar31._0_8_ = 0x2000200020002;
      auVar31._10_2_ = 2;
      auVar31._12_2_ = 2;
      auVar31._14_2_ = 2;
      auVar31._16_2_ = 2;
      auVar31._18_2_ = 2;
      auVar31._20_2_ = 2;
      auVar31._22_2_ = 2;
      auVar31._24_2_ = 2;
      auVar31._26_2_ = 2;
      auVar31._28_2_ = 2;
      auVar31._30_2_ = 2;
      auVar61 = vpmullw_avx2(auVar61,auVar31);
      auVar81 = vpaddw_avx2(auVar81,auVar61);
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar39 * 2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar39 * 2));
      auVar143._16_16_ = auVar55;
      auVar143._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar39 * -2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar39 * -2 + 0x120));
      auVar131._16_16_ = auVar55;
      auVar131._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar43 * 2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar43 * 2));
      auVar106._16_16_ = auVar55;
      auVar106._0_16_ = auVar56;
      auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar43 * -2));
      auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar43 * -2 + 0x120));
      auVar121._16_16_ = auVar55;
      auVar121._0_16_ = auVar56;
      auVar12._16_8_ = uVar125;
      auVar12._0_16_ = auVar123;
      auVar12._24_8_ = uVar126;
      auVar61 = vpsubw_avx2(auVar143,auVar12);
      auVar60 = vpsraw_avx2(auVar61,0xf);
      auVar61 = vpabsw_avx2(auVar61);
      auVar3 = vpsrlw_avx2(auVar61,auVar54);
      auVar3 = vpsubusw_avx2(auVar32,auVar3);
      auVar61 = vpminsw_avx2(auVar61,auVar3);
      auVar3 = vpaddw_avx2(auVar61,auVar60);
      auVar13._16_8_ = uVar125;
      auVar13._0_16_ = auVar123;
      auVar13._24_8_ = uVar126;
      auVar61 = vpsubw_avx2(auVar131,auVar13);
      auVar119 = vpsraw_avx2(auVar61,0xf);
      auVar61 = vpabsw_avx2(auVar61);
      auVar99 = vpsrlw_avx2(auVar61,auVar54);
      auVar99 = vpsubusw_avx2(auVar32,auVar99);
      auVar61 = vpminsw_avx2(auVar61,auVar99);
      auVar61 = vpaddw_avx2(auVar119,auVar61);
      auVar3 = vpaddw_avx2(auVar119 ^ auVar61,auVar3 ^ auVar60);
      auVar14._16_8_ = uVar125;
      auVar14._0_16_ = auVar123;
      auVar14._24_8_ = uVar126;
      auVar60 = vpsubw_avx2(auVar106,auVar14);
      auVar61 = vpabsw_avx2(auVar60);
      auVar99 = vpsrlw_avx2(auVar61,auVar54);
      auVar120 = vpsraw_avx2(auVar60,0xf);
      auVar99 = vpsubusw_avx2(auVar32,auVar99);
      auVar61 = vpminsw_avx2(auVar61,auVar99);
      auVar99 = vpaddw_avx2(auVar61,auVar120);
      auVar15._16_8_ = uVar125;
      auVar15._0_16_ = auVar123;
      auVar15._24_8_ = uVar126;
      auVar119 = vpsubw_avx2(auVar121,auVar15);
      auVar61 = vpabsw_avx2(auVar119);
      auVar60 = vpsrlw_avx2(auVar61,auVar54);
      auVar60 = vpsubusw_avx2(auVar32,auVar60);
      auVar61 = vpminsw_avx2(auVar61,auVar60);
      auVar60 = vpsraw_avx2(auVar119,0xf);
      auVar61 = vpaddw_avx2(auVar61,auVar60);
      auVar61 = vpaddw_avx2(auVar99 ^ auVar120,auVar61 ^ auVar60);
      auVar61 = vpaddw_avx2(auVar3,auVar61);
      auVar29._8_2_ = 1;
      auVar29._0_8_ = 0x1000100010001;
      auVar29._10_2_ = 1;
      auVar29._12_2_ = 1;
      auVar29._14_2_ = 1;
      auVar29._16_2_ = 1;
      auVar29._18_2_ = 1;
      auVar29._20_2_ = 1;
      auVar29._22_2_ = 1;
      auVar29._24_2_ = 1;
      auVar29._26_2_ = 1;
      auVar29._28_2_ = 1;
      auVar29._30_2_ = 1;
      auVar61 = vpmullw_avx2(auVar61,auVar29);
      auVar61 = vpaddw_avx2(auVar61,auVar81);
      auVar81 = vpand_avx2(auVar97,auVar26);
      auVar3 = vpmaxsw_avx2(auVar81,auVar98);
      auVar81 = vpand_avx2(auVar133,auVar26);
      auVar3 = vpmaxsw_avx2(auVar3,auVar81);
      auVar81 = vpand_avx2(auVar139,auVar26);
      auVar99 = vpmaxsw_avx2(auVar3,auVar81);
      auVar81 = vpand_avx2(auVar140,auVar26);
      auVar3 = vpand_avx2(auVar143,auVar26);
      auVar3 = vpmaxsw_avx2(auVar81,auVar3);
      auVar81 = vpand_avx2(auVar131,auVar26);
      auVar3 = vpmaxsw_avx2(auVar3,auVar81);
      auVar81 = vpand_avx2(auVar106,auVar26);
      auVar3 = vpmaxsw_avx2(auVar3,auVar81);
      auVar81 = vpand_avx2(auVar121,auVar26);
      auVar81 = vpmaxsw_avx2(auVar3,auVar81);
      auVar16._16_8_ = uVar125;
      auVar16._0_16_ = auVar123;
      auVar16._24_8_ = uVar126;
      auVar3 = vpmaxsw_avx2(auVar16,auVar99);
      auVar81 = vpmaxsw_avx2(auVar3,auVar81);
      auVar3 = vpminsw_avx2(auVar97,auVar137);
      auVar3 = vpminsw_avx2(auVar133,auVar3);
      auVar3 = vpminsw_avx2(auVar139,auVar3);
      auVar3 = vpminsw_avx2(auVar140,auVar3);
      auVar99 = vpminsw_avx2(auVar143,auVar131);
      auVar99 = vpminsw_avx2(auVar99,auVar106);
      auVar99 = vpminsw_avx2(auVar99,auVar121);
      auVar17._16_8_ = uVar125;
      auVar17._0_16_ = auVar123;
      auVar17._24_8_ = uVar126;
      auVar3 = vpminsw_avx2(auVar17,auVar3);
      auVar3 = vpminsw_avx2(auVar3,auVar99);
      auVar99 = vpsraw_avx2(auVar61,0xf);
      auVar25._8_2_ = 8;
      auVar25._0_8_ = 0x8000800080008;
      auVar25._10_2_ = 8;
      auVar25._12_2_ = 8;
      auVar25._14_2_ = 8;
      auVar25._16_2_ = 8;
      auVar25._18_2_ = 8;
      auVar25._20_2_ = 8;
      auVar25._22_2_ = 8;
      auVar25._24_2_ = 8;
      auVar25._26_2_ = 8;
      auVar25._28_2_ = 8;
      auVar25._30_2_ = 8;
      auVar61 = vpaddw_avx2(auVar61,auVar25);
      auVar61 = vpaddw_avx2(auVar61,auVar99);
      auVar61 = vpsraw_avx2(auVar61,4);
      auVar18._16_8_ = uVar125;
      auVar18._0_16_ = auVar123;
      auVar18._24_8_ = uVar126;
      auVar61 = vpaddw_avx2(auVar18,auVar61);
      auVar61 = vpmaxsw_avx2(auVar61,auVar3);
      auVar61 = vpminsw_avx2(auVar61,auVar81);
      *(undefined1 (*) [16])dest = auVar61._16_16_;
      *(undefined1 (*) [16])
       ((long)*(undefined1 (*) [16])dest + CONCAT26(sStack_194,(int6)dstride) * 2) = auVar61._0_16_;
      dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar42 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar42 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar42 = 0;
      }
    }
    uVar49 = sec_damping;
    if (sec_strength != 0) {
      iVar2 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar49 = sec_damping - iVar2;
      if (sec_damping < iVar2) {
        uVar49 = 0;
      }
    }
    auVar53 = ZEXT416(uVar49);
    lVar41 = (long)dstride;
    lVar48 = lVar43 * -2;
    lVar40 = lVar39 * -2;
    lVar50 = lVar47 * -2;
    lVar46 = lVar37 * -2;
    lVar45 = lVar36 * -2;
    lVar44 = lVar35 * -2;
    auVar61._8_2_ = 0xbfff;
    auVar61._0_8_ = 0xbfffbfffbfffbfff;
    auVar61._10_2_ = 0xbfff;
    auVar61._12_2_ = 0xbfff;
    auVar61._14_2_ = 0xbfff;
    auVar61._16_2_ = 0xbfff;
    auVar61._18_2_ = 0xbfff;
    auVar61._20_2_ = 0xbfff;
    auVar61._22_2_ = 0xbfff;
    auVar61._24_2_ = 0xbfff;
    auVar61._26_2_ = 0xbfff;
    auVar61._28_2_ = 0xbfff;
    auVar61._30_2_ = 0xbfff;
    for (lVar38 = 0; lVar38 < block_height; lVar38 = lVar38 + 4) {
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)in;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = *(ulong *)((long)in + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar124,auVar54);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)((long)in + 0x240);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)((long)in + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar82,auVar65);
      auVar124 = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar54 = ZEXT116(1) * auVar54;
      uVar125 = auVar54._0_8_;
      uVar126 = auVar54._8_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)((long)in + lVar35 * 2);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)((long)in + lVar35 * 2 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar66,auVar55);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)((long)in + lVar35 * 2 + 0x240);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = *(ulong *)((long)in + lVar35 * 2 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar83,auVar67);
      auVar132._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar132._16_16_ = ZEXT116(1) * auVar54;
      auVar81._16_8_ = uVar125;
      auVar81._0_16_ = auVar124;
      auVar81._24_8_ = uVar126;
      auVar99 = vpsubw_avx2(auVar132,auVar81);
      auVar81 = vpabsw_avx2(auVar99);
      auVar56 = ZEXT416(uVar42);
      auVar3 = vpsrlw_avx2(auVar81,auVar56);
      auVar137 = vpsraw_avx2(auVar99,0xf);
      auVar33._2_2_ = local_118._2_2_;
      auVar33._0_2_ = local_118._2_2_;
      auVar33._4_2_ = local_118._2_2_;
      auVar33._6_2_ = local_118._2_2_;
      auVar33._8_2_ = local_118._2_2_;
      auVar33._10_2_ = local_118._2_2_;
      auVar33._12_2_ = local_118._2_2_;
      auVar33._14_2_ = local_118._2_2_;
      auVar33._16_2_ = local_118._2_2_;
      auVar33._18_2_ = local_118._2_2_;
      auVar33._20_2_ = local_118._2_2_;
      auVar33._22_2_ = local_118._2_2_;
      auVar33._24_2_ = local_118._2_2_;
      auVar33._26_2_ = local_118._2_2_;
      auVar33._28_2_ = local_118._2_2_;
      auVar33._30_2_ = local_118._2_2_;
      auVar3 = vpsubusw_avx2(auVar33,auVar3);
      auVar81 = vpminsw_avx2(auVar81,auVar3);
      auVar3 = vpaddw_avx2(auVar81,auVar137);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)((long)in + lVar44);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = *(ulong *)((long)in + lVar44 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar84,auVar68);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)((long)in + lVar44 + 0x240);
      auVar102._8_8_ = 0;
      auVar102._0_8_ = *(ulong *)((long)in + lVar44 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar102,auVar85);
      auVar112._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar112._16_16_ = ZEXT116(1) * auVar54;
      auVar99._16_8_ = uVar125;
      auVar99._0_16_ = auVar124;
      auVar99._24_8_ = uVar126;
      auVar98 = vpsubw_avx2(auVar112,auVar99);
      auVar81 = vpabsw_avx2(auVar98);
      auVar99 = vpsrlw_avx2(auVar81,auVar56);
      auVar98 = vpsraw_avx2(auVar98,0xf);
      auVar99 = vpsubusw_avx2(auVar33,auVar99);
      auVar81 = vpminsw_avx2(auVar81,auVar99);
      auVar81 = vpaddw_avx2(auVar81,auVar98);
      auVar81 = vpaddw_avx2(auVar81 ^ auVar98,auVar3 ^ auVar137);
      uVar1 = (undefined2)cdef_pri_taps[bVar51][0];
      auVar79._2_2_ = uVar1;
      auVar79._0_2_ = uVar1;
      auVar79._4_2_ = uVar1;
      auVar79._6_2_ = uVar1;
      auVar79._8_2_ = uVar1;
      auVar79._10_2_ = uVar1;
      auVar79._12_2_ = uVar1;
      auVar79._14_2_ = uVar1;
      auVar79._16_2_ = uVar1;
      auVar79._18_2_ = uVar1;
      auVar79._20_2_ = uVar1;
      auVar79._22_2_ = uVar1;
      auVar79._24_2_ = uVar1;
      auVar79._26_2_ = uVar1;
      auVar79._28_2_ = uVar1;
      auVar79._30_2_ = uVar1;
      auVar99 = vpmullw_avx2(auVar81,auVar79);
      auVar123._8_8_ = 0;
      auVar123._0_8_ = *(ulong *)((long)in + lVar36 * 2);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = *(ulong *)((long)in + lVar36 * 2 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar86,auVar123);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)((long)in + lVar36 * 2 + 0x240);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = *(ulong *)((long)in + lVar36 * 2 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar103,auVar87);
      auVar62._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar62._16_16_ = ZEXT116(1) * auVar54;
      auVar3._16_8_ = uVar125;
      auVar3._0_16_ = auVar124;
      auVar3._24_8_ = uVar126;
      auVar98 = vpsubw_avx2(auVar62,auVar3);
      auVar81 = vpabsw_avx2(auVar98);
      auVar3 = vpsrlw_avx2(auVar81,auVar56);
      auVar60 = vpsraw_avx2(auVar98,0xf);
      auVar3 = vpsubusw_avx2(auVar33,auVar3);
      auVar81 = vpminsw_avx2(auVar81,auVar3);
      auVar3 = vpaddw_avx2(auVar81,auVar60);
      auVar104._8_8_ = 0;
      auVar104._0_8_ = *(ulong *)((long)in + lVar45);
      auVar114._8_8_ = 0;
      auVar114._0_8_ = *(ulong *)((long)in + lVar45 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar114,auVar104);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = *(ulong *)((long)in + lVar45 + 0x240);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = *(ulong *)((long)in + lVar45 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar127,auVar115);
      auVar101._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar101._16_16_ = ZEXT116(1) * auVar54;
      auVar98._16_8_ = uVar125;
      auVar98._0_16_ = auVar124;
      auVar98._24_8_ = uVar126;
      auVar137 = vpsubw_avx2(auVar101,auVar98);
      auVar81 = vpabsw_avx2(auVar137);
      auVar98 = vpsrlw_avx2(auVar81,auVar56);
      auVar137 = vpsraw_avx2(auVar137,0xf);
      auVar98 = vpsubusw_avx2(auVar33,auVar98);
      auVar81 = vpminsw_avx2(auVar98,auVar81);
      auVar81 = vpaddw_avx2(auVar81,auVar137);
      auVar81 = vpaddw_avx2(auVar81 ^ auVar137,auVar3 ^ auVar60);
      uVar1 = (undefined2)cdef_pri_taps[bVar51][1];
      auVar107._2_2_ = uVar1;
      auVar107._0_2_ = uVar1;
      auVar107._4_2_ = uVar1;
      auVar107._6_2_ = uVar1;
      auVar107._8_2_ = uVar1;
      auVar107._10_2_ = uVar1;
      auVar107._12_2_ = uVar1;
      auVar107._14_2_ = uVar1;
      auVar107._16_2_ = uVar1;
      auVar107._18_2_ = uVar1;
      auVar107._20_2_ = uVar1;
      auVar107._22_2_ = uVar1;
      auVar107._24_2_ = uVar1;
      auVar107._26_2_ = uVar1;
      auVar107._28_2_ = uVar1;
      auVar107._30_2_ = uVar1;
      auVar81 = vpmullw_avx2(auVar81,auVar107);
      auVar3 = vpaddw_avx2(auVar81,auVar99);
      auVar81 = vpand_avx2(auVar132,auVar61);
      auVar137._16_8_ = uVar125;
      auVar137._0_16_ = auVar124;
      auVar137._24_8_ = uVar126;
      auVar98 = vpmaxsw_avx2(auVar137,auVar81);
      auVar81 = vpand_avx2(auVar112,auVar61);
      auVar99 = vpand_avx2(auVar62,auVar61);
      auVar81 = vpmaxsw_avx2(auVar81,auVar99);
      auVar137 = vpmaxsw_avx2(auVar98,auVar81);
      auVar60._16_8_ = uVar125;
      auVar60._0_16_ = auVar124;
      auVar60._24_8_ = uVar126;
      auVar81 = vpminsw_avx2(auVar60,auVar132);
      auVar99 = vpminsw_avx2(auVar112,auVar62);
      auVar60 = vpminsw_avx2(auVar81,auVar99);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)((long)in + lVar37 * 2);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)((long)in + lVar37 * 2 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar69,auVar56);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)((long)in + lVar37 * 2 + 0x240);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)((long)in + lVar37 * 2 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar88,auVar70);
      auVar63._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar63._16_16_ = ZEXT116(1) * auVar54;
      auVar119._16_8_ = uVar125;
      auVar119._0_16_ = auVar124;
      auVar119._24_8_ = uVar126;
      auVar81 = vpsubw_avx2(auVar63,auVar119);
      auVar119 = vpsraw_avx2(auVar81,0xf);
      auVar81 = vpabsw_avx2(auVar81);
      auVar99 = vpsrlw_avx2(auVar81,auVar53);
      auVar30._2_2_ = uVar52;
      auVar30._0_2_ = uVar52;
      auVar30._4_2_ = uVar52;
      auVar30._6_2_ = uVar52;
      auVar30._8_2_ = uVar52;
      auVar30._10_2_ = uVar52;
      auVar30._12_2_ = uVar52;
      auVar30._14_2_ = uVar52;
      auVar30._16_2_ = uVar52;
      auVar30._18_2_ = uVar52;
      auVar30._20_2_ = uVar52;
      auVar30._22_2_ = uVar52;
      auVar30._24_2_ = uVar52;
      auVar30._26_2_ = uVar52;
      auVar30._28_2_ = uVar52;
      auVar30._30_2_ = uVar52;
      auVar99 = vpsubusw_avx2(auVar30,auVar99);
      auVar81 = vpminsw_avx2(auVar81,auVar99);
      auVar99 = vpaddw_avx2(auVar81,auVar119);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)((long)in + lVar46);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)((long)in + lVar46 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar89,auVar71);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = *(ulong *)((long)in + lVar46 + 0x240);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = *(ulong *)((long)in + lVar46 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar108,auVar90);
      auVar141._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar141._16_16_ = ZEXT116(1) * auVar54;
      auVar120._16_8_ = uVar125;
      auVar120._0_16_ = auVar124;
      auVar120._24_8_ = uVar126;
      auVar81 = vpsubw_avx2(auVar141,auVar120);
      auVar120 = vpsraw_avx2(auVar81,0xf);
      auVar81 = vpabsw_avx2(auVar81);
      auVar98 = vpsrlw_avx2(auVar81,auVar53);
      auVar98 = vpsubusw_avx2(auVar30,auVar98);
      auVar81 = vpminsw_avx2(auVar81,auVar98);
      auVar81 = vpaddw_avx2(auVar81,auVar120);
      auVar99 = vpaddw_avx2(auVar81 ^ auVar120,auVar99 ^ auVar119);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)((long)in + lVar47 * 2);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = *(ulong *)((long)in + lVar47 * 2 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar91,auVar72);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)((long)in + lVar47 * 2 + 0x240);
      auVar109._8_8_ = 0;
      auVar109._0_8_ = *(ulong *)((long)in + lVar47 * 2 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar109,auVar92);
      auVar142._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar142._16_16_ = ZEXT116(1) * auVar54;
      auVar113._16_8_ = uVar125;
      auVar113._0_16_ = auVar124;
      auVar113._24_8_ = uVar126;
      auVar81 = vpsubw_avx2(auVar142,auVar113);
      auVar120 = vpsraw_avx2(auVar81,0xf);
      auVar81 = vpabsw_avx2(auVar81);
      auVar98 = vpsrlw_avx2(auVar81,auVar53);
      auVar98 = vpsubusw_avx2(auVar30,auVar98);
      auVar81 = vpminsw_avx2(auVar81,auVar98);
      auVar98 = vpaddw_avx2(auVar81,auVar120);
      auVar93._8_8_ = 0;
      auVar93._0_8_ = *(ulong *)((long)in + lVar50);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = *(ulong *)((long)in + lVar50 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar110,auVar93);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = *(ulong *)((long)in + lVar50 + 0x240);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)((long)in + lVar50 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar116,auVar111);
      auVar144._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar144._16_16_ = ZEXT116(1) * auVar54;
      auVar19._16_8_ = uVar125;
      auVar19._0_16_ = auVar124;
      auVar19._24_8_ = uVar126;
      auVar81 = vpsubw_avx2(auVar144,auVar19);
      auVar113 = vpsraw_avx2(auVar81,0xf);
      auVar81 = vpabsw_avx2(auVar81);
      auVar119 = vpsrlw_avx2(auVar81,auVar53);
      auVar119 = vpsubusw_avx2(auVar30,auVar119);
      auVar81 = vpminsw_avx2(auVar81,auVar119);
      auVar81 = vpaddw_avx2(auVar81,auVar113);
      auVar81 = vpaddw_avx2(auVar98 ^ auVar120,auVar81 ^ auVar113);
      auVar81 = vpaddw_avx2(auVar99,auVar81);
      auVar28._8_2_ = 2;
      auVar28._0_8_ = 0x2000200020002;
      auVar28._10_2_ = 2;
      auVar28._12_2_ = 2;
      auVar28._14_2_ = 2;
      auVar28._16_2_ = 2;
      auVar28._18_2_ = 2;
      auVar28._20_2_ = 2;
      auVar28._22_2_ = 2;
      auVar28._24_2_ = 2;
      auVar28._26_2_ = 2;
      auVar28._28_2_ = 2;
      auVar28._30_2_ = 2;
      auVar81 = vpmullw_avx2(auVar81,auVar28);
      auVar3 = vpaddw_avx2(auVar3,auVar81);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)((long)in + lVar39 * 2);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)((long)in + lVar39 * 2 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar73,auVar57);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)((long)in + lVar39 * 2 + 0x240);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = *(ulong *)((long)in + lVar39 * 2 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar94,auVar74);
      auVar134._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar134._16_16_ = ZEXT116(1) * auVar54;
      auVar20._16_8_ = uVar125;
      auVar20._0_16_ = auVar124;
      auVar20._24_8_ = uVar126;
      auVar81 = vpsubw_avx2(auVar134,auVar20);
      auVar119 = vpsraw_avx2(auVar81,0xf);
      auVar81 = vpabsw_avx2(auVar81);
      auVar99 = vpsrlw_avx2(auVar81,auVar53);
      auVar99 = vpsubusw_avx2(auVar30,auVar99);
      auVar81 = vpminsw_avx2(auVar81,auVar99);
      auVar99 = vpaddw_avx2(auVar81,auVar119);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)((long)in + lVar40);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = *(ulong *)((long)in + lVar40 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar95,auVar75);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = *(ulong *)((long)in + lVar40 + 0x240);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = *(ulong *)((long)in + lVar40 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar117,auVar96);
      auVar122._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar122._16_16_ = ZEXT116(1) * auVar54;
      auVar21._16_8_ = uVar125;
      auVar21._0_16_ = auVar124;
      auVar21._24_8_ = uVar126;
      auVar81 = vpsubw_avx2(auVar122,auVar21);
      auVar120 = vpsraw_avx2(auVar81,0xf);
      auVar81 = vpabsw_avx2(auVar81);
      auVar98 = vpsrlw_avx2(auVar81,auVar53);
      auVar98 = vpsubusw_avx2(auVar30,auVar98);
      auVar81 = vpminsw_avx2(auVar98,auVar81);
      auVar81 = vpaddw_avx2(auVar81,auVar120);
      auVar99 = vpaddw_avx2(auVar81 ^ auVar120,auVar99 ^ auVar119);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)((long)in + lVar43 * 2);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)((long)in + lVar43 * 2 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar76,auVar58);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)((long)in + lVar43 * 2 + 0x240);
      auVar129._8_8_ = 0;
      auVar129._0_8_ = *(ulong *)((long)in + lVar43 * 2 + 0x360);
      auVar55 = vpunpcklqdq_avx(auVar129,auVar77);
      auVar64._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar64._16_16_ = ZEXT116(1) * auVar54;
      auVar22._16_8_ = uVar125;
      auVar22._0_16_ = auVar124;
      auVar22._24_8_ = uVar126;
      auVar119 = vpsubw_avx2(auVar64,auVar22);
      auVar81 = vpabsw_avx2(auVar119);
      auVar98 = vpsrlw_avx2(auVar81,auVar53);
      auVar113 = vpsraw_avx2(auVar119,0xf);
      auVar98 = vpsubusw_avx2(auVar30,auVar98);
      auVar81 = vpminsw_avx2(auVar81,auVar98);
      auVar98 = vpaddw_avx2(auVar81,auVar113);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)((long)in + lVar48);
      auVar135._8_8_ = 0;
      auVar135._0_8_ = *(ulong *)((long)in + lVar48 + 0x120);
      auVar54 = vpunpcklqdq_avx(auVar135,auVar78);
      auVar128._8_8_ = 0;
      auVar128._0_8_ = *(ulong *)((long)in + lVar48 + 0x360);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = *(ulong *)((long)in + lVar48 + 0x240);
      auVar55 = vpunpcklqdq_avx(auVar128,auVar136);
      auVar80._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar55;
      auVar80._16_16_ = ZEXT116(1) * auVar54;
      auVar23._16_8_ = uVar125;
      auVar23._0_16_ = auVar124;
      auVar23._24_8_ = uVar126;
      auVar120 = vpsubw_avx2(auVar80,auVar23);
      auVar81 = vpabsw_avx2(auVar120);
      auVar119 = vpsrlw_avx2(auVar81,auVar53);
      auVar119 = vpsubusw_avx2(auVar30,auVar119);
      auVar81 = vpminsw_avx2(auVar81,auVar119);
      auVar119 = vpsraw_avx2(auVar120,0xf);
      auVar81 = vpaddw_avx2(auVar119,auVar81);
      auVar81 = vpaddw_avx2(auVar98 ^ auVar113,auVar119 ^ auVar81);
      auVar81 = vpaddw_avx2(auVar99,auVar81);
      auVar99 = vpand_avx2(auVar101,auVar61);
      auVar27._8_2_ = 1;
      auVar27._0_8_ = 0x1000100010001;
      auVar27._10_2_ = 1;
      auVar27._12_2_ = 1;
      auVar27._14_2_ = 1;
      auVar27._16_2_ = 1;
      auVar27._18_2_ = 1;
      auVar27._20_2_ = 1;
      auVar27._22_2_ = 1;
      auVar27._24_2_ = 1;
      auVar27._26_2_ = 1;
      auVar27._28_2_ = 1;
      auVar27._30_2_ = 1;
      auVar81 = vpmullw_avx2(auVar81,auVar27);
      auVar81 = vpaddw_avx2(auVar81,auVar3);
      auVar3 = vpand_avx2(auVar63,auVar61);
      auVar99 = vpmaxsw_avx2(auVar3,auVar99);
      auVar3 = vpand_avx2(auVar141,auVar61);
      auVar3 = vpmaxsw_avx2(auVar3,auVar99);
      auVar98 = vpmaxsw_avx2(auVar3,auVar137);
      auVar3 = vpand_avx2(auVar142,auVar61);
      auVar99 = vpand_avx2(auVar144,auVar61);
      auVar99 = vpmaxsw_avx2(auVar3,auVar99);
      auVar3 = vpand_avx2(auVar134,auVar61);
      auVar99 = vpmaxsw_avx2(auVar99,auVar3);
      auVar3 = vpand_avx2(auVar122,auVar61);
      auVar3 = vpmaxsw_avx2(auVar99,auVar3);
      auVar98 = vpmaxsw_avx2(auVar3,auVar98);
      auVar3 = vpand_avx2(auVar64,auVar61);
      auVar99 = vpand_avx2(auVar80,auVar61);
      auVar3 = vpmaxsw_avx2(auVar3,auVar99);
      auVar3 = vpmaxsw_avx2(auVar3,auVar98);
      auVar99 = vpminsw_avx2(auVar101,auVar63);
      auVar99 = vpminsw_avx2(auVar99,auVar141);
      auVar99 = vpminsw_avx2(auVar99,auVar60);
      auVar98 = vpminsw_avx2(auVar142,auVar144);
      auVar98 = vpminsw_avx2(auVar98,auVar134);
      auVar98 = vpminsw_avx2(auVar98,auVar122);
      auVar99 = vpminsw_avx2(auVar99,auVar98);
      auVar98 = vpminsw_avx2(auVar64,auVar80);
      auVar99 = vpminsw_avx2(auVar99,auVar98);
      auVar98 = vpsraw_avx2(auVar81,0xf);
      auVar34._8_2_ = 8;
      auVar34._0_8_ = 0x8000800080008;
      auVar34._10_2_ = 8;
      auVar34._12_2_ = 8;
      auVar34._14_2_ = 8;
      auVar34._16_2_ = 8;
      auVar34._18_2_ = 8;
      auVar34._20_2_ = 8;
      auVar34._22_2_ = 8;
      auVar34._24_2_ = 8;
      auVar34._26_2_ = 8;
      auVar34._28_2_ = 8;
      auVar34._30_2_ = 8;
      auVar81 = vpaddw_avx2(auVar81,auVar34);
      auVar81 = vpaddw_avx2(auVar81,auVar98);
      auVar81 = vpsraw_avx2(auVar81,4);
      auVar24._16_8_ = uVar125;
      auVar24._0_16_ = auVar124;
      auVar24._24_8_ = uVar126;
      auVar81 = vpaddw_avx2(auVar24,auVar81);
      auVar81 = vpmaxsw_avx2(auVar81,auVar99);
      auVar81 = vpminsw_avx2(auVar81,auVar3);
      uVar125 = vpextrq_avx(auVar81._16_16_,1);
      *(undefined8 *)dest = uVar125;
      *(long *)((long)dest + lVar41 * 2) = auVar81._16_8_;
      uVar125 = vpextrq_avx(auVar81._0_16_,1);
      *(undefined8 *)((long)dest + lVar41 * 4) = uVar125;
      *(long *)((long)dest + lVar41 * 6) = auVar81._0_8_;
      dest = (void *)((long)dest + lVar41 * 8);
      in = (uint16_t *)((long)in + 0x480);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_0)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}